

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

uint64_t ptls_decode_quicint(uint8_t **src,uint8_t *end)

{
  byte bVar1;
  byte *pbVar2;
  uint64_t uVar3;
  uint uVar4;
  int iVar5;
  
  pbVar2 = *src;
  uVar3 = 0xffffffffffffffff;
  if (pbVar2 != end) {
    *src = pbVar2 + 1;
    bVar1 = *pbVar2;
    if ((ulong)bVar1 < 0x40) {
      return (ulong)bVar1;
    }
    uVar4 = -1 << (bVar1 >> 6);
    if ((ulong)~uVar4 <= (ulong)((long)end - (long)(pbVar2 + 1))) {
      uVar3 = (uint64_t)(bVar1 & 0x3f);
      iVar5 = uVar4 + 1;
      pbVar2 = *src;
      do {
        *src = pbVar2 + 1;
        uVar3 = uVar3 << 8 | (ulong)*pbVar2;
        iVar5 = iVar5 + 1;
        pbVar2 = pbVar2 + 1;
      } while (iVar5 != 0);
    }
  }
  return uVar3;
}

Assistant:

uint64_t ptls_decode_quicint(const uint8_t **src, const uint8_t *end)
{
    if (PTLS_UNLIKELY(*src == end))
        return UINT64_MAX;

    uint8_t b = *(*src)++;

    if (PTLS_LIKELY(b <= 0x3f))
        return b;

    uint64_t v = b & 0x3f;
    unsigned bytes_left = (1 << (b >> 6)) - 1;
    if (PTLS_UNLIKELY((size_t)(end - *src) < bytes_left))
        return UINT64_MAX;
    do {
        v = (v << 8) | *(*src)++;
    } while (--bytes_left != 0);
    return v;
}